

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackIFWGenerator::GetGroupPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponentGroup *group)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  int iVar4;
  cmCPackIFWPackage *pcVar5;
  long *plVar6;
  char *__s;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  bool bVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  _Alloc_hider local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined4 uStack_37;
  undefined2 uStack_33;
  char cStack_31;
  
  local_48 = 0;
  local_40 = '\0';
  if (group == (cmCPackComponentGroup *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_38,uStack_3f);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_37;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_33;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_31;
    __return_storage_ptr__->_M_string_length = 0;
  }
  else {
    local_50._M_p = &local_40;
    pcVar5 = GetGroupPackage(this,group);
    if (pcVar5 != (cmCPackIFWPackage *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pcVar5->Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pcVar5->Name)._M_string_length);
      goto LAB_0016b585;
    }
    cmsys::SystemTools::UpperCase(&local_90,&group->Name);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x53fa5a);
    local_70 = &local_60;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar6[3];
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar6;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_b0.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    __s = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (__s == (char *)0x0) {
      pcVar3 = (group->Name)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + (group->Name)._M_string_length);
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)paVar1;
      sVar7 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,__s,__s + sVar7);
    }
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (group->ParentGroup != (cmCPackComponentGroup *)0x0) {
      pcVar5 = GetGroupPackage(this,group->ParentGroup);
      bVar2 = this->ResolveDuplicateNames;
      if (bVar2 == false) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_50);
        if (local_b0._M_string_length != (pcVar5->Name)._M_string_length) goto LAB_0016b44a;
        if (local_b0._M_string_length == 0) {
          bVar10 = true;
        }
        else {
          iVar4 = bcmp(local_b0._M_dataplus._M_p,(pcVar5->Name)._M_dataplus._M_p,
                       local_b0._M_string_length);
          bVar10 = iVar4 == 0;
        }
      }
      else {
LAB_0016b44a:
        bVar10 = false;
      }
      if ((bVar2 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1)) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10 && (bVar2 & 1U) == 0) {
        pcVar3 = (pcVar5->Name)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + (pcVar5->Name)._M_string_length);
        std::__cxx11::string::append((char *)&local_90);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_p);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar6[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
          local_70 = (long *)*plVar6;
        }
        local_68 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_50._M_p == &local_40) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(cStack_31,CONCAT25(uStack_33,CONCAT41(uStack_37,uStack_38)));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    }
    __return_storage_ptr__->_M_string_length = local_48;
  }
  local_48 = 0;
  local_40 = '\0';
  local_50._M_p = &local_40;
LAB_0016b585:
  if (local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetGroupPackageName(
  cmCPackComponentGroup* group) const
{
  std::string name;
  if (!group) {
    return name;
  }
  if (cmCPackIFWPackage* package = this->GetGroupPackage(group)) {
    return package->Name;
  }
  const char* option =
    this->GetOption("CPACK_IFW_COMPONENT_GROUP_" +
                    cmsys::SystemTools::UpperCase(group->Name) + "_NAME");
  name = option ? option : group->Name;
  if (group->ParentGroup) {
    cmCPackIFWPackage* package = this->GetGroupPackage(group->ParentGroup);
    bool dot = !this->ResolveDuplicateNames;
    if (dot && name.substr(0, package->Name.size()) == package->Name) {
      dot = false;
    }
    if (dot) {
      name = package->Name + "." + name;
    }
  }
  return name;
}